

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  uint uVar1;
  TRef TVar2;
  long lVar3;
  ulong uVar4;
  int32_t k;
  char cVar5;
  TRef TVar6;
  double dVar7;
  uint *puVar8;
  uint uVar9;
  GCproto *pGVar10;
  BCIns *pBVar11;
  
  pGVar10 = J->pt + 1;
  pBVar11 = endpc;
  TVar2 = slot;
  do {
    puVar8 = pBVar11 + -1;
    if (puVar8 <= pGVar10) {
      return 0;
    }
    uVar1 = *puVar8;
    uVar9 = uVar1 & 0xff;
    TVar6 = 1;
    if ((lj_bc_mode[uVar9] & 7) == 1) {
      if ((uVar1 >> 8 & 0xff) != slot) goto LAB_00144d58;
      cVar5 = '\0';
      TVar2 = 0;
      if (uVar9 - 0x29 < 2) {
        puVar8 = pBVar11 + -1;
        if (pGVar10 < puVar8) {
          lVar3 = -0x20004;
          do {
            if (((char)*puVar8 == 'X') &&
               (uVar4 = (ulong)(*puVar8 >> 0xe & 0x3fffc), TVar6 = 0, TVar2 = TVar6,
               (BCIns *)((long)puVar8 + (uVar4 - 0x1fffc)) <= endpc && -8 < (long)(lVar3 + uVar4)))
            goto LAB_00144d58;
            puVar8 = puVar8 + -1;
            lVar3 = lVar3 + -4;
          } while (pGVar10 < puVar8);
        }
        if (uVar9 == 0x29) {
          k = (int)uVar1 >> 0x10;
          if (t == IRT_IGC) {
LAB_00144d27:
            TVar2 = lj_ir_kint(J,k);
          }
          else {
            dVar7 = (double)k;
LAB_00144d43:
            TVar2 = lj_ir_knum_u64(J,(uint64_t)dVar7);
          }
          cVar5 = '\0';
        }
        else {
          uVar4 = (ulong)(J->pt->k).ptr32;
          if (t != IRT_IGC) {
            dVar7 = *(double *)(uVar4 + (ulong)(uVar1 >> 0x10) * 8);
            goto LAB_00144d43;
          }
          dVar7 = *(double *)(uVar4 + (ulong)(uVar1 >> 0x10) * 8);
          if ((dVar7 == (double)(int)dVar7) && (!NAN(dVar7) && !NAN((double)(int)dVar7))) {
            k = (int32_t)dVar7;
            goto LAB_00144d27;
          }
          cVar5 = '\0';
          TVar2 = 0;
        }
      }
    }
    else {
      if (((lj_bc_mode[uVar9] & 7) == 2) && ((uVar1 >> 8 & 0xff) <= slot)) {
        cVar5 = '\0';
        TVar2 = 0;
        goto LAB_00144d5a;
      }
LAB_00144d58:
      cVar5 = (char)TVar6;
    }
LAB_00144d5a:
    pBVar11 = puVar8;
    if (cVar5 == '\0') {
      return TVar2;
    }
  } while( true );
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}